

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::insert_example_at_node(recall_tree *b,uint32_t cn,example *ec)

{
  float fVar1;
  bool bVar2;
  node_pred *pnVar3;
  node *pnVar4;
  node_pred **ppnVar5;
  long in_RDX;
  uint in_ESI;
  node *in_RDI;
  double dVar6;
  recall_tree *unaff_retaddr;
  example *in_stack_00000010;
  uint32_t in_stack_0000001c;
  recall_tree *in_stack_00000020;
  node_pred *ls;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined8 in_stack_ffffffffffffffd8;
  recall_tree *in_stack_ffffffffffffffe0;
  node_pred *__b;
  
  pnVar3 = find_or_create(in_stack_ffffffffffffffe0,
                          (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (example *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  dVar6 = updated_entropy(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  pnVar4 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)&in_RDI->base_router,(ulong)in_ESI);
  pnVar4->entropy = dVar6;
  pnVar3->label_count = (double)*(float *)(in_RDX + 0x6870) + pnVar3->label_count;
  while( true ) {
    __b = pnVar3;
    pnVar4 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)&in_RDI->base_router,(ulong)in_ESI);
    ppnVar5 = v_array<recall_tree_ns::node_pred>::begin(&pnVar4->preds);
    bVar2 = false;
    if (pnVar3 != *ppnVar5) {
      bVar2 = __b[-1].label_count < __b->label_count;
    }
    if (!bVar2) break;
    std::swap<recall_tree_ns::node_pred>(__b + -1,__b);
    pnVar3 = __b + -1;
  }
  fVar1 = *(float *)(in_RDX + 0x6870);
  pnVar4 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)&in_RDI->base_router,(ulong)in_ESI);
  pnVar4->n = (double)fVar1 + pnVar4->n;
  v_array<recall_tree_ns::node>::operator[]
            ((v_array<recall_tree_ns::node> *)&in_RDI->base_router,(ulong)in_ESI);
  compute_recall_lbest(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void insert_example_at_node(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find_or_create(b, cn, ec);

  b.nodes[cn].entropy = updated_entropy(b, cn, ec);

  ls->label_count += ec.weight;

  while (ls != b.nodes[cn].preds.begin() && ls[-1].label_count < ls[0].label_count)
  {
    std::swap(ls[-1], ls[0]);
    --ls;
  }

  b.nodes[cn].n += ec.weight;

  compute_recall_lbest(b, &b.nodes[cn]);
}